

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O3

void __thiscall
CorUnix::CSharedMemoryFileLockController::ReleaseController(CSharedMemoryFileLockController *this)

{
  if (this->m_shmFileLocks != 0) {
    FILECleanUpLockedRgn(this->m_shmFileLocks,this->m_dwAccessRights,this);
  }
  (*(this->super_IFileLockController)._vptr_IFileLockController[4])(this);
  InternalFree(this);
  return;
}

Assistant:

void
CSharedMemoryFileLockController::ReleaseController()
{
    if (SHMNULL != m_shmFileLocks)
    {
        FILECleanUpLockedRgn(
            m_shmFileLocks,
            m_dwAccessRights,
            reinterpret_cast<PVOID>(this)
            );
    }

    InternalDelete(this);
}